

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messages.cpp
# Opt level: O1

void polyscope::terminatingError(string *message)

{
  pointer pcVar1;
  ostream *poVar2;
  int __how;
  type func;
  _Any_data local_60;
  code *local_50;
  undefined1 local_40 [16];
  _Alloc_hider local_30;
  char local_20 [16];
  _Any_data *p_Var3;
  
  if (0 < options::verbosity) {
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,options::printPrefix_abi_cxx11_,DAT_004bdc60);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"[ERROR] ",8);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar2,(message->_M_dataplus)._M_p,message->_M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
  }
  local_40._0_8_ = anon_unknown_1::buildErrorUI;
  local_40[8] = true;
  pcVar1 = (message->_M_dataplus)._M_p;
  local_30._M_p = local_20;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_30,pcVar1,pcVar1 + message->_M_string_length);
  std::function<void()>::
  function<std::_Bind<void(*(std::__cxx11::string,bool))(std::__cxx11::string,bool)>&,void>
            ((function<void()> *)local_60._M_pod_data,
             (_Bind<void_(*(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool))(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool)>
              *)local_40);
  __how = 0;
  pushContext((function<void_()> *)&local_60,false);
  if (local_50 != (code *)0x0) {
    p_Var3 = &local_60;
    (*local_50)(p_Var3,p_Var3,__destroy_functor);
    __how = (int)p_Var3;
  }
  shutdown(-1,__how);
  if (local_30._M_p != local_20) {
    operator_delete(local_30._M_p);
  }
  return;
}

Assistant:

void terminatingError(std::string message) {
  if (options::verbosity > 0) {
    std::cout << options::printPrefix << "[ERROR] " << message << std::endl;
  }

  auto func = std::bind(buildErrorUI, message, true);
  pushContext(func, false);

  // Quit the program
  shutdown(-1);
}